

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

string * __thiscall
PrintMenu::findMyType_abi_cxx11_(string *__return_storage_ptr__,PrintMenu *this,DishType type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (type == SPC) {
    pcVar2 = "SPC";
    paVar1 = &local_b;
  }
  else if (type == BVG) {
    pcVar2 = "BVG";
    paVar1 = &local_a;
  }
  else if (type == ALC) {
    pcVar2 = "ALC";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "VEG";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintMenu::findMyType(DishType type)
{
    if (type == ALC)
        return "ALC";
    if(type == BVG)
        return "BVG";
    if (type == SPC)
        return "SPC";
    return "VEG";
}